

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O3

floatx80 propagateFloatx80NaN_sparc64(floatx80 a,floatx80 b,float_status *status)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  floatx80 fVar11;
  
  uVar6 = a.low;
  uVar4 = b.low;
  uVar5 = a._8_4_;
  uVar3 = b._8_4_;
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
      (~uVar5 & 0x7fff) != 0) {
    bVar7 = 2;
    if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
        (~uVar3 & 0x7fff) == 0) goto LAB_00a0bb61;
    bVar9 = false;
    bVar8 = false;
  }
  else {
    bVar9 = ((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0;
    bVar10 = ((undefined1  [16])a & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0;
    if ((~uVar3 & 0x7fff) == 0 &&
        ((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
      bVar7 = (bVar10 && bVar9) | 4;
LAB_00a0bb61:
      bVar10 = ((undefined1  [16])b & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0
               && ((undefined1  [16])b & (undefined1  [16])0x3fffffffffffffff) !=
                  (undefined1  [16])0x0;
      bVar9 = bVar7 == 5;
      bVar8 = !bVar9 || bVar10;
      if (bVar10 || bVar9) {
LAB_00a0bba8:
        status->float_exception_flags = status->float_exception_flags | 1;
        goto LAB_00a0bbbd;
      }
    }
    else {
      bVar8 = false;
      if (bVar10 && bVar9) {
        bVar9 = true;
        bVar7 = 5;
        goto LAB_00a0bba8;
      }
      bVar7 = 4;
    }
    bVar8 = false;
    bVar9 = false;
  }
LAB_00a0bbbd:
  if (status->default_nan_mode != '\0') {
    uVar2 = 0xc000000000000000;
    uVar3 = (uint)CONCAT62(b._10_6_,0xffff);
    goto LAB_00a0bc46;
  }
  bVar10 = true;
  if (uVar4 <= uVar6) {
    bVar10 = b.high <= a.high && uVar6 <= uVar4;
  }
  if (bVar7 == 5) {
    bVar1 = bVar8 == true;
    if (bVar8 == true) {
      bVar1 = bVar10;
    }
joined_r0x00a0bc38:
    if (!bVar1) {
      uVar2 = uVar6 | 0xc000000000000000;
      uVar3 = uVar5;
      if (!bVar9) {
        uVar2 = uVar6;
      }
      goto LAB_00a0bc46;
    }
  }
  else if (bVar7 == 4) {
    bVar1 = (bool)(bVar8 != true & bVar8 == true & bVar10);
    goto joined_r0x00a0bc38;
  }
  uVar2 = uVar4 | 0xc000000000000000;
  if (bVar8 != true) {
    uVar2 = uVar4;
  }
LAB_00a0bc46:
  fVar11._8_4_ = uVar3;
  fVar11.low = uVar2;
  fVar11._12_4_ = 0;
  return fVar11;
}

Assistant:

floatx80 propagateFloatx80NaN(floatx80 a, floatx80 b, float_status *status)
{
    flag aIsLargerSignificand;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!floatx80_is_any_nan(a)
             ? float_class_normal
             : floatx80_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!floatx80_is_any_nan(b)
             ? float_class_normal
             : floatx80_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return floatx80_default_nan(status);
    }

    if (a.low < b.low) {
        aIsLargerSignificand = 0;
    } else if (b.low < a.low) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (a.high < b.high) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return floatx80_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return floatx80_silence_nan(a, status);
        }
        return a;
    }
}